

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcBlast.c
# Opt level: O0

void Wlc_IntSortCostReverse(Gia_Man_t *pNew,int *pArray,int nSize)

{
  int iVar1;
  int iVar2;
  int local_28;
  int t;
  int best_i;
  int j;
  int i;
  int nSize_local;
  int *pArray_local;
  Gia_Man_t *pNew_local;
  
  for (best_i = 0; best_i < nSize + -1; best_i = best_i + 1) {
    local_28 = best_i;
    t = best_i;
    while (t = t + 1, t < nSize) {
      iVar1 = Abc_Lit2Var(pArray[t]);
      iVar1 = Gia_ObjLevelId(pNew,iVar1);
      iVar2 = Abc_Lit2Var(pArray[local_28]);
      iVar2 = Gia_ObjLevelId(pNew,iVar2);
      if (iVar2 < iVar1) {
        local_28 = t;
      }
    }
    iVar1 = pArray[best_i];
    pArray[best_i] = pArray[local_28];
    pArray[local_28] = iVar1;
  }
  return;
}

Assistant:

void Wlc_IntSortCostReverse( Gia_Man_t * pNew, int * pArray, int nSize )
{
    int i, j, best_i;
    for ( i = 0; i < nSize-1; i++ )
    {
        best_i = i;
        for ( j = i+1; j < nSize; j++ )
            if ( Gia_ObjLevelId(pNew, Abc_Lit2Var(pArray[j])) > Gia_ObjLevelId(pNew, Abc_Lit2Var(pArray[best_i])) )
                best_i = j;
        ABC_SWAP( int, pArray[i], pArray[best_i] );
    }
}